

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O1

bool __thiscall
cmOptionCommand::InitialPass
          (cmOptionCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *this_00;
  PolicyStatus PVar2;
  CacheEntryType CVar3;
  string *psVar4;
  cmState *this_01;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  PolicyID id;
  _Alloc_hider _Var8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  string initialValue;
  string m;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  uVar9 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffc0;
  if (uVar9 == 0x40) {
    bVar11 = false;
    PVar2 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0077,false);
    cmMakefile::GetStateSnapshot((this->super_cmCommand).Makefile);
    psVar4 = cmStateSnapshot::GetDefinition
                       ((cmStateSnapshot *)local_1a8,
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    if (PVar2 - NEW < 3) {
      bVar10 = psVar4 == (string *)0x0;
      bVar11 = false;
    }
    else {
      bVar10 = true;
      if (PVar2 == WARN) {
        bVar11 = psVar4 != (string *)0x0;
      }
    }
    if (!bVar10) goto LAB_00240f30;
    this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    pcVar5 = cmState::GetCacheEntryValue
                       (this_01,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "Off";
    }
    else {
      CVar3 = cmState::GetCacheEntryType
                        (this_01,(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (CVar3 != UNINITIALIZED) {
        psVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1a8._0_8_ = (cmState *)local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"HELPSTRING","");
        cmState::SetCacheEntryProperty
                  (this_01,psVar4,(string *)local_1a8,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1);
        local_1e8.field_2._M_allocated_capacity = local_198._0_8_;
        _Var8._M_p = (pointer)local_1a8._0_8_;
        if ((cmState *)local_1a8._0_8_ == (cmState *)local_198) goto LAB_00240f30;
        goto LAB_00240f28;
      }
    }
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,pcVar5,pcVar5 + sVar6);
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x60) {
      std::__cxx11::string::_M_assign((string *)&local_1e8);
    }
    bVar10 = cmSystemTools::IsOn(&local_1e8);
    psVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = "OFF";
    if (bVar10) {
      pcVar5 = "ON";
    }
    cmMakefile::AddCacheDefinition
              ((this->super_cmCommand).Makefile,psVar4,pcVar5,psVar4[1]._M_dataplus._M_p,BOOL,false)
    ;
    if (bVar11) {
      cmMakefile::GetStateSnapshot((this->super_cmCommand).Makefile);
      psVar4 = cmStateSnapshot::GetDefinition
                         ((cmStateSnapshot *)local_1a8,
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      if (psVar4 == (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x4d,id);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                            local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "\nFor compatibility with older versions of CMake, option is clearing the normal variable \'"
                   ,0x59);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'.",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
      }
    }
    _Var8._M_p = local_1e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) goto LAB_00240f30;
  }
  else {
    local_1a8._0_8_ = (cmState *)local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments: ","");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_1e8,args," ");
    std::__cxx11::string::_M_append(local_1a8,(ulong)local_1e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    local_1e8.field_2._M_allocated_capacity = local_198._0_8_;
    _Var8._M_p = (pointer)local_1a8._0_8_;
    if ((cmState *)local_1a8._0_8_ == (cmState *)local_198) goto LAB_00240f30;
  }
LAB_00240f28:
  operator_delete(_Var8._M_p,local_1e8.field_2._M_allocated_capacity + 1);
LAB_00240f30:
  return uVar9 == 0x40;
}

Assistant:

bool cmOptionCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  const bool argError = (args.size() < 2) || (args.size() > 3);
  if (argError) {
    std::string m = "called with incorrect number of arguments: ";
    m += cmJoin(args, " ");
    this->SetError(m);
    return false;
  }

  // Determine the state of the option policy
  bool checkAndWarn = false;
  {
    auto status = this->Makefile->GetPolicyStatus(cmPolicies::CMP0077);
    const auto* existsBeforeSet =
      this->Makefile->GetStateSnapshot().GetDefinition(args[0]);
    switch (status) {
      case cmPolicies::WARN:
        checkAndWarn = (existsBeforeSet != nullptr);
        break;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW: {
        // See if a local variable with this name already exists.
        // If so we ignore the option command.
        if (existsBeforeSet) {
          return true;
        }
      } break;
    }
  }

  // See if a cache variable with this name already exists
  // If so just make sure the doc state is correct
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(args[0]);
  if (existingValue &&
      (state->GetCacheEntryType(args[0]) != cmStateEnums::UNINITIALIZED)) {
    state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
    return true;
  }

  // Nothing in the cache so add it
  std::string initialValue = existingValue ? existingValue : "Off";
  if (args.size() == 3) {
    initialValue = args[2];
  }
  bool init = cmSystemTools::IsOn(initialValue);
  this->Makefile->AddCacheDefinition(args[0], init ? "ON" : "OFF",
                                     args[1].c_str(), cmStateEnums::BOOL);

  if (checkAndWarn) {
    const auto* existsAfterSet =
      this->Makefile->GetStateSnapshot().GetDefinition(args[0]);
    if (!existsAfterSet) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0077)
        << "\n"
           "For compatibility with older versions of CMake, option "
           "is clearing the normal variable '"
        << args[0] << "'.";
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }
  return true;
}